

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

int Gia_ManQuantCountUsed_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  iVar4 = 0;
  while (iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj), iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pGVar3 = Gia_ManObj(p,iObj);
    if ((~(uint)*(undefined8 *)pGVar3 & 0x9fffffff) == 0) break;
    iVar2 = Gia_ManQuantCheckSupp(p,iObj - ((uint)*(undefined8 *)pGVar3 & 0x1fffffff),p->iSuppPi);
    iVar1 = 1;
    if (iVar2 != 0) {
      iVar1 = Gia_ManQuantCountUsed_rec(p,iObj - (*(uint *)pGVar3 & 0x1fffffff));
      iVar1 = iVar1 + 1;
    }
    iVar2 = Gia_ManQuantCheckSupp(p,iObj - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff),p->iSuppPi);
    if (iVar2 == 0) goto LAB_001ebcad;
    iObj = iObj - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff);
    iVar4 = iVar4 + iVar1;
  }
  iVar1 = 0;
LAB_001ebcad:
  return iVar1 + iVar4;
}

Assistant:

int Gia_ManQuantCountUsed_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj; int Count = 1;
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
        return 0;
    Gia_ObjSetTravIdCurrentId( p, iObj );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    if ( Gia_ManQuantCheckSupp(p, Gia_ObjFaninId0(pObj, iObj), p->iSuppPi) )
        Count += Gia_ManQuantCountUsed_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    if ( Gia_ManQuantCheckSupp(p, Gia_ObjFaninId1(pObj, iObj), p->iSuppPi) )
        Count += Gia_ManQuantCountUsed_rec( p, Gia_ObjFaninId1(pObj, iObj) );
    return Count;
}